

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O0

void CVApolynomialFree(CVodeMem cv_mem)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  long in_RDI;
  long i;
  CVpolynomialDataMem content;
  CVdtpntMem *dt_mem;
  CVadjMem ca_mem;
  long local_28;
  
  lVar1 = *(long *)(in_RDI + 0xa70);
  N_VDestroy(*(undefined8 *)(lVar1 + 0x1f8));
  if (*(int *)(lVar1 + 0xb8) != 0) {
    N_VDestroyVectorArray(*(undefined8 *)(lVar1 + 0x200),*(undefined4 *)(in_RDI + 0x90));
  }
  lVar2 = *(long *)(lVar1 + 0x78);
  for (local_28 = 0; local_28 <= *(long *)(lVar1 + 0x68); local_28 = local_28 + 1) {
    puVar3 = *(undefined8 **)(*(long *)(lVar2 + local_28 * 8) + 8);
    N_VDestroy(*puVar3);
    if (*(int *)(lVar1 + 0xb8) != 0) {
      N_VDestroyVectorArray(puVar3[1],*(undefined4 *)(in_RDI + 0x90));
    }
    free(*(void **)(*(long *)(lVar2 + local_28 * 8) + 8));
    *(undefined8 *)(*(long *)(lVar2 + local_28 * 8) + 8) = 0;
  }
  return;
}

Assistant:

static void CVApolynomialFree(CVodeMem cv_mem)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVpolynomialDataMem content;
  long int i;

  ca_mem = cv_mem->cv_adj_mem;

  N_VDestroy(ca_mem->ca_ytmp);

  if (ca_mem->ca_IMstoreSensi)
  {
    N_VDestroyVectorArray(ca_mem->ca_yStmp, cv_mem->cv_Ns);
  }

  dt_mem = ca_mem->dt_mem;

  for (i = 0; i <= ca_mem->ca_nsteps; i++)
  {
    content = (CVpolynomialDataMem)(dt_mem[i]->content);
    N_VDestroy(content->y);
    if (ca_mem->ca_IMstoreSensi)
    {
      N_VDestroyVectorArray(content->yS, cv_mem->cv_Ns);
    }
    free(dt_mem[i]->content);
    dt_mem[i]->content = NULL;
  }
}